

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe16At3(uint8_t *buf)

{
  return (ulong)((*buf & 0x1f) * 0x800 + (uint)buf[1] * 8 | (uint)(buf[2] >> 5));
}

Assistant:

std::uint64_t readFlUIntBe16At3(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 3;
    res |= (buf[2] >> 5);
    res &= UINT64_C(0xffff);
    return res;
}